

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_right_delim_join.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalRightDelimJoin::BuildPipelines
          (PhysicalRightDelimJoin *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> _Var2;
  pointer prVar3;
  MetaPipeline *this_00;
  reference pvVar4;
  PipelineBuildState *pPVar5;
  shared_ptr<duckdb::Pipeline,_true> *this_01;
  reference_wrapper<const_duckdb::PhysicalOperator> *delim_scan;
  pointer prVar6;
  PhysicalOperator *local_40;
  type local_38;
  
  _Var1._M_head_impl =
       (this->super_PhysicalDelimJoin).super_PhysicalOperator.op_state.
       super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
       .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl;
  (this->super_PhysicalDelimJoin).super_PhysicalOperator.op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  if (_Var1._M_head_impl != (GlobalOperatorState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalOperatorState[1])();
  }
  _Var2._M_head_impl =
       (this->super_PhysicalDelimJoin).super_PhysicalOperator.sink_state.
       super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  (this->super_PhysicalDelimJoin).super_PhysicalOperator.sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  if (_Var2._M_head_impl != (GlobalSinkState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_GlobalSinkState + 8))();
  }
  this_00 = MetaPipeline::CreateChildMetaPipeline
                      (meta_pipeline,current,(PhysicalOperator *)this,REGULAR);
  pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(this->super_PhysicalDelimJoin).super_PhysicalOperator.children,0);
  MetaPipeline::Build(this_00,pvVar4->_M_data);
  pPVar5 = MetaPipeline::GetState(meta_pipeline);
  prVar6 = (this->super_PhysicalDelimJoin).delim_scans.
           super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar3 = (this->super_PhysicalDelimJoin).delim_scans.
           super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar6 != prVar3) {
    do {
      this_01 = MetaPipeline::GetBasePipeline(this_00);
      local_38 = shared_ptr<duckdb::Pipeline,_true>::operator*(this_01);
      local_40 = prVar6->_M_data;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>,std::allocator<std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::PhysicalOperator_const>,duckdb::ReferenceHashFunction<duckdb::PhysicalOperator_const>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<duckdb::PhysicalOperator_const&,duckdb::Pipeline&>>
                ((_Hashtable<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>,std::allocator<std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::PhysicalOperator_const>,duckdb::ReferenceHashFunction<duckdb::PhysicalOperator_const>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)pPVar5,&local_40);
      prVar6 = prVar6 + 1;
    } while (prVar6 != prVar3);
  }
  PhysicalJoin::BuildJoinPipelines(current,meta_pipeline,(this->super_PhysicalDelimJoin).join,false)
  ;
  return;
}

Assistant:

void PhysicalRightDelimJoin::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	op_state.reset();
	sink_state.reset();

	auto &child_meta_pipeline = meta_pipeline.CreateChildMetaPipeline(current, *this);
	child_meta_pipeline.Build(children[0]);

	D_ASSERT(type == PhysicalOperatorType::RIGHT_DELIM_JOIN);
	// recurse into the actual join
	// any pipelines in there depend on the main pipeline
	// any scan of the duplicate eliminated data on the LHS depends on this pipeline
	// we add an entry to the mapping of (PhysicalOperator*) -> (Pipeline*)
	auto &state = meta_pipeline.GetState();
	for (auto &delim_scan : delim_scans) {
		state.delim_join_dependencies.insert(
		    make_pair(delim_scan, reference<Pipeline>(*child_meta_pipeline.GetBasePipeline())));
	}

	// Build join pipelines without building the RHS (already built in the Sink of this op)
	PhysicalJoin::BuildJoinPipelines(current, meta_pipeline, join, false);
}